

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeCoTest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  bool bVar1;
  type_conflict5 tVar2;
  int iVar3;
  Verbosity VVar4;
  int *piVar5;
  streamsize sVar6;
  cpp_dec_float<200U,_int,_void> *u;
  cpp_dec_float<200U,_int,_void> *this_00;
  SPxOut *i_00;
  long in_RDI;
  streamsize prec;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  Status stat;
  Desc *ds;
  int sparsitythreshold;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pricingTol;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffa98;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffaa0;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffab0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffab8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffac0;
  int local_520;
  int local_51c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_518;
  undefined1 local_498 [128];
  Status in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffbf0;
  undefined4 local_408;
  Verbosity local_404;
  undefined1 local_400 [128];
  undefined4 local_380;
  Verbosity local_37c;
  undefined1 local_378 [128];
  undefined1 local_2f8 [128];
  undefined4 local_278;
  Status local_274;
  Desc *local_270;
  int local_268;
  undefined1 local_264 [128];
  int local_1e4;
  undefined4 local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1dc;
  int local_15c;
  undefined8 local_150;
  int *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  undefined4 *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined4 *local_128;
  long local_120;
  undefined1 *local_118;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  undefined4 *local_108;
  undefined4 *local_100;
  int *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  long local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  int *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  int *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  int *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  leavetol(in_stack_fffffffffffffab8);
  *(undefined1 *)(in_RDI + 0x77c) = 1;
  local_1e0 = 0;
  local_120 = in_RDI + 0x6fc;
  local_128 = &local_1e0;
  local_108 = local_128;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffaa0,
             (long_long_type)in_stack_fffffffffffffa98);
  *(undefined4 *)(in_RDI + 0x804) = 0;
  IdxSet::clear((IdxSet *)(in_RDI + 0x1380));
  local_268 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x6a7929);
  local_70 = local_264;
  local_80 = &local_268;
  local_78 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(in_RDI + 0xb7c);
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_81,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(in_RDI + 0xb7c));
  local_68 = local_264;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffaa0);
  local_50 = local_264;
  local_58 = local_78;
  local_60 = local_80;
  local_90 = (long)*local_80;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
             (longlong *)0x6a79f1);
  local_1e4 = boost::multiprecision::number::operator_cast_to_int
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6a79fe);
  local_270 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::desc((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)(in_RDI + 0x238));
  local_15c = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x6a7a28);
  while (local_15c = local_15c + -1, -1 < local_15c) {
    local_274 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Desc::coStatus((Desc *)in_stack_fffffffffffffaa0,
                                 (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
    bVar1 = isBasic(in_stack_fffffffffffffaa0,(Status)((ulong)in_stack_fffffffffffffa98 >> 0x20));
    if (bVar1) {
      local_278 = 0;
      local_130 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_fffffffffffffaa0,
                               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
      local_138 = &local_278;
      local_100 = local_138;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffaa0,
                 (long_long_type)in_stack_fffffffffffffa98);
      if (*(int *)(in_RDI + 0x143c) == 0) {
        piVar5 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1400),local_15c);
        *piVar5 = 0;
      }
    }
    else {
      coTest(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8);
      local_110 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_fffffffffffffaa0,
                               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
      local_118 = local_2f8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffaa0,
                 in_stack_fffffffffffffa98);
      iVar3 = (int)((ulong)in_stack_fffffffffffffa98 >> 0x20);
      if (*(int *)(in_RDI + 0x143c) == 0) {
        in_stack_fffffffffffffac0 =
             VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_fffffffffffffaa0,iVar3);
        local_b0 = local_378;
        local_b8 = &local_1dc;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_b9,local_b8);
        local_a0 = local_378;
        local_a8 = local_b8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffaa0,
                   in_stack_fffffffffffffa98);
        local_98 = local_378;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffaa0);
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffffa98,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x6a7c36);
        if (tVar2) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_fffffffffffffaa0,(int)((ulong)in_stack_fffffffffffffa98 >> 0x20))
          ;
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator-=(in_stack_fffffffffffffac0,(self_type *)in_stack_fffffffffffffab8);
          DIdxSet::addIdx((DIdxSet *)in_stack_fffffffffffffaa0,
                          (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
          piVar5 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1400),local_15c);
          *piVar5 = 1;
          *(int *)(in_RDI + 0x804) = *(int *)(in_RDI + 0x804) + 1;
        }
        else {
          piVar5 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1400),local_15c);
          *piVar5 = 0;
        }
        iVar3 = IdxSet::size((IdxSet *)(in_RDI + 0x1380));
        if (local_1e4 < iVar3) {
          if ((*(long *)(in_RDI + 0x14b0) != 0) &&
             (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x14b0)), 3 < (int)VVar4)) {
            local_37c = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x14b0));
            local_380 = 4;
            (**(code **)(**(long **)(in_RDI + 0x14b0) + 0x10))
                      (*(long **)(in_RDI + 0x14b0),&local_380);
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98
                              );
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffaa0,
                               (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffa98);
            (**(code **)(**(long **)(in_RDI + 0x14b0) + 0x10))
                      (*(long **)(in_RDI + 0x14b0),&local_37c);
          }
          *(undefined4 *)(in_RDI + 0x143c) = 5;
          *(undefined1 *)(in_RDI + 0x1431) = 0;
          IdxSet::clear((IdxSet *)(in_RDI + 0x1380));
        }
      }
      else {
        in_stack_fffffffffffffab8 =
             (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffffaa0,iVar3);
        local_e0 = local_400;
        local_e8 = &local_1dc;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_e9,local_e8);
        local_d0 = local_400;
        local_d8 = local_e8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffaa0,
                   in_stack_fffffffffffffa98);
        local_c8 = local_400;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffaa0);
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffffa98,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x6a7e85);
        if (tVar2) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_fffffffffffffaa0,(int)((ulong)in_stack_fffffffffffffa98 >> 0x20))
          ;
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator-=(in_stack_fffffffffffffac0,(self_type *)in_stack_fffffffffffffab8);
          *(int *)(in_RDI + 0x804) = *(int *)(in_RDI + 0x804) + 1;
        }
      }
    }
  }
  iVar3 = IdxSet::size((IdxSet *)(in_RDI + 0x1380));
  if ((iVar3 == 0) && ((*(byte *)(in_RDI + 0x1431) & 1) == 0)) {
    *(int *)(in_RDI + 0x143c) = *(int *)(in_RDI + 0x143c) + -1;
  }
  else {
    iVar3 = IdxSet::size((IdxSet *)(in_RDI + 0x1380));
    if ((iVar3 <= local_1e4) && ((*(byte *)(in_RDI + 0x1431) & 1) == 0)) {
      if ((*(long *)(in_RDI + 0x14b0) != 0) &&
         (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x14b0)), 3 < (int)VVar4)) {
        local_404 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x14b0));
        local_408 = 4;
        (**(code **)(**(long **)(in_RDI + 0x14b0) + 0x10))(*(long **)(in_RDI + 0x14b0),&local_408);
        sVar6 = SPxOut::precision((SPxOut *)0x6a7fd7);
        iVar3 = (int)sVar6;
        if ((*(byte *)(in_RDI + 0x1434) & 1) == 0) {
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
        }
        else {
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
        }
        u = (cpp_dec_float<200U,_int,_void> *)
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98
                              );
        std::setw(6);
        soplex::operator<<((SPxOut *)u,(_Setw)(int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
        this_00 = (cpp_dec_float<200U,_int,_void> *)
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffaa0,
                                     (_func_ios_base_ptr_ios_base_ptr *)u);
        std::setprecision(4);
        i_00 = soplex::operator<<((SPxOut *)u,(_Setprecision)(int)((ulong)this_00 >> 0x20));
        local_51c = IdxSet::size((IdxSet *)(in_RDI + 0x1380));
        local_140 = &local_518;
        local_148 = &local_51c;
        local_150 = 0;
        local_f8 = local_148;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (in_stack_fffffffffffffab0,(longlong)i_00,this_00);
        local_520 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x6a810b);
        local_28 = local_498;
        local_30 = &local_518;
        local_38 = &local_520;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_39,local_30);
        local_20 = local_498;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00);
        local_8 = local_498;
        local_10 = local_30;
        local_18 = local_38;
        local_48 = (long)*local_38;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                  (this_00,u,(longlong *)0x6a81cb);
        soplex::operator<<((SPxOut *)this_00,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)u);
        soplex::operator<<((SPxOut *)this_00,(_func_ios_base_ptr_ios_base_ptr *)u);
        std::setprecision(iVar3);
        soplex::operator<<((SPxOut *)u,(_Setprecision)(int)((ulong)this_00 >> 0x20));
        soplex::operator<<((SPxOut *)this_00,(_func_ostream_ptr_ostream_ptr *)u);
        (**(code **)(**(long **)(in_RDI + 0x14b0) + 0x10))(*(long **)(in_RDI + 0x14b0),&local_404);
      }
      *(undefined1 *)(in_RDI + 0x1431) = 1;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeCoTest()
{
   int i;
   R pricingTol = leavetol();
   m_pricingViolUpToDate = true;
   m_pricingViol = 0;
   m_numViol = 0;
   infeasibilities.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * dim());
   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   for(i = dim() - 1; i >= 0; --i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.coStatus(i);

      if(isBasic(stat))
      {
         theCoTest[i] = 0;

         if(remainingRoundsEnter == 0)
            isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         theCoTest[i] = coTest(i, stat);

         if(remainingRoundsEnter == 0)
         {
            if(theCoTest[i] < -pricingTol)
            {
               assert(infeasibilities.size() < infeasibilities.max());
               m_pricingViol -= theCoTest[i];
               infeasibilities.addIdx(i);
               isInfeasible[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilities.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnter = SOPLEX_DENSEROUNDS;
               sparsePricingEnter = false;
               infeasibilities.clear();
            }
         }
         else if(theCoTest[i] < -pricingTol)
         {
            m_pricingViol -= theCoTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilities.size() == 0 && !sparsePricingEnter)
      --remainingRoundsEnter;
   else if(infeasibilities.size() <= sparsitythreshold && !sparsePricingEnter)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilities.size() / dim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnter = true;
   }
}